

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPParser.cpp
# Opt level: O0

void __thiscall MADPParser::Parse(MADPParser *this,FactoredDecPOMDPDiscrete *model)

{
  ParserProbModelXML parser;
  FactoredDecPOMDPDiscrete *in_stack_fffffffffffffec8;
  ParserProbModelXML *this_00;
  ParserProbModelXML *in_stack_ffffffffffffff40;
  
  this_00 = (ParserProbModelXML *)&stack0xfffffffffffffee8;
  ParserProbModelXML::ParserProbModelXML(this_00,in_stack_fffffffffffffec8);
  ParserProbModelXML::Parse(in_stack_ffffffffffffff40);
  ParserProbModelXML::~ParserProbModelXML(this_00);
  return;
}

Assistant:

void MADPParser::Parse(FactoredDecPOMDPDiscrete *model)
{
    ParserProbModelXML parser(model);
    parser.Parse();
}